

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZSpectralTransform.cpp
# Opt level: O2

TPZAutoPointer<TPZMatrix<float>_> __thiscall
TPZSTShiftOrigin<float>::CalcMatrix
          (TPZSTShiftOrigin<float> *this,TPZAutoPointer<TPZMatrix<float>_> *A)

{
  float fVar1;
  TPZSpectralTransform<float> TVar2;
  long *plVar3;
  TPZSpectralTransform<float> *in_RDX;
  long lVar4;
  long lVar5;
  float local_2c;
  
  TVar2 = *in_RDX;
  lVar4 = *(long *)(*(long *)TVar2 + 8);
  this->super_TPZSpectralTransform<float> = TVar2;
  LOCK();
  *(int *)((long)TVar2 + 8) = *(int *)((long)TVar2 + 8) + 1;
  UNLOCK();
  fVar1 = *(float *)&A[1].fRef;
  lVar5 = 0;
  if (lVar4 < 1) {
    lVar4 = lVar5;
  }
  for (; lVar4 != lVar5; lVar5 = lVar5 + 1) {
    plVar3 = *(long **)this->super_TPZSpectralTransform<float>;
    local_2c = (float)(**(code **)(*plVar3 + 0x120))(plVar3,lVar5,lVar5);
    local_2c = local_2c - fVar1;
    (**(code **)(*plVar3 + 0x118))(plVar3,lVar5,lVar5,&local_2c);
  }
  return (TPZAutoPointer<TPZMatrix<float>_>)(TPZReference *)this;
}

Assistant:

TPZAutoPointer<TPZMatrix<TVar>>
TPZSTShiftOrigin<TVar>::CalcMatrix(TPZAutoPointer<TPZMatrix<TVar>>A) const
{
  const auto nRows = A->Rows();
  TPZAutoPointer<TPZMatrix<TVar>> shiftedMat = A;
  //calculating A-sigmaB
  const auto &shift = Shift();
  for(int i = 0; i < nRows; i++) shiftedMat->PutVal(i,i,shiftedMat->GetVal(i,i)-shift);
  return shiftedMat;
}